

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_str.c
# Opt level: O0

void tc_ap_str_trim_head_from_set(CuTest *tc)

{
  char *pcVar1;
  char local_818 [8];
  char buf_set [1024];
  char buf_str [1024];
  CuTest *tc_local;
  
  strcpy(local_818," \t");
  pcVar1 = ap_str_trim_head_from_set((char *)0x0,(char *)0x0);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x13,"strings should be equal",(char *)0x0,pcVar1);
  strcpy(buf_set + 0x3f8,"");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x16,"strings should be equal","",pcVar1);
  strcpy(buf_set + 0x3f8," ");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x19,"strings should be equal","",pcVar1);
  strcpy(buf_set + 0x3f8,"  ");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x1c,"strings should be equal","",pcVar1);
  strcpy(buf_set + 0x3f8,"  ");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x1f,"strings should be equal","",pcVar1);
  strcpy(buf_set + 0x3f8,"\t");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x22,"strings should be equal","",pcVar1);
  strcpy(buf_set + 0x3f8,"\t\t");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x25,"strings should be equal","",pcVar1);
  strcpy(buf_set + 0x3f8,"\t\t\t");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x28,"strings should be equal","",pcVar1);
  strcpy(buf_set + 0x3f8," a");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x2b,"strings should be equal","a",pcVar1);
  strcpy(buf_set + 0x3f8,"  a");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x2e,"strings should be equal","a",pcVar1);
  strcpy(buf_set + 0x3f8,"   a");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x31,"strings should be equal","a",pcVar1);
  strcpy(buf_set + 0x3f8,"\ta");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x34,"strings should be equal","a",pcVar1);
  strcpy(buf_set + 0x3f8,"\t\ta");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x37,"strings should be equal","a",pcVar1);
  strcpy(buf_set + 0x3f8,"\t\t\ta");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x3a,"strings should be equal","a",pcVar1);
  strcpy(buf_set + 0x3f8," a ");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x3d,"strings should be equal","a ",pcVar1);
  strcpy(buf_set + 0x3f8,"a ");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x40,"strings should be equal","a ",pcVar1);
  strcpy(buf_set + 0x3f8,"a  ");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x43,"strings should be equal","a  ",pcVar1);
  strcpy(buf_set + 0x3f8,"a   ");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x46,"strings should be equal","a   ",pcVar1);
  strcpy(buf_set + 0x3f8,"a\t");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x49,"strings should be equal","a\t",pcVar1);
  strcpy(buf_set + 0x3f8,"a\t\t");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x4c,"strings should be equal","a\t\t",pcVar1);
  strcpy(buf_set + 0x3f8,"a\t\t\t");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x4f,"strings should be equal","a\t\t\t",pcVar1);
  strcpy(buf_set + 0x3f8," a\t");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x52,"strings should be equal","a\t",pcVar1);
  strcpy(buf_set + 0x3f8," a \t");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x55,"strings should be equal","a \t",pcVar1);
  strcpy(buf_set + 0x3f8," \t \t \ta \t \t \t \t");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x58,"strings should be equal","a \t \t \t \t",pcVar1);
  strcpy(buf_set + 0x3f8,"aaa bbb ccc");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x5b,"strings should be equal","aaa bbb ccc",pcVar1);
  strcpy(buf_set + 0x3f8,"         aaa bbb ccc");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8,local_818);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x5e,"strings should be equal","aaa bbb ccc",pcVar1);
  strcpy(buf_set + 0x3f8,"  \t\t  \t  \taaa bbb ccc");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x61,"strings should be equal","aaa bbb ccc",pcVar1);
  strcpy(buf_set + 0x3f8,"  \t\t  \t  \taaa bbb ccc \t \t \t   ");
  pcVar1 = ap_str_trim_head_from_set(buf_set + 0x3f8," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,100,"strings should be equal","aaa bbb ccc \t \t \t   ",pcVar1);
  return;
}

Assistant:

static void tc_ap_str_trim_head_from_set (CuTest* tc)
{
	char	buf_str[1024];
	char	buf_set[1024];

	strcpy (buf_set, " \t");

	CuAssertStrEquals_Msg (tc, "strings should be equal", NULL,							ap_str_trim_head_from_set (NULL, NULL));

	strcpy (buf_str, "");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, " ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "  ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "  ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "\t\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, " a");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "  a");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "   a");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "\ta");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "\t\ta");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "\t\t\ta");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, " a ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a ",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "a ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a ",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "a  ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a  ",						ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "a   ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a   ",						ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "a\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a\t",						ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "a\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a\t\t",						ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "a\t\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a\t\t\t",					ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, " a\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a\t",						ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, " a \t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a \t",						ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, " \t \t \ta \t \t \t \t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a \t \t \t \t",				ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "aaa bbb ccc");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "aaa bbb ccc",				ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "         aaa bbb ccc");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "aaa bbb ccc",				ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "  \t\t  \t  \taaa bbb ccc");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "aaa bbb ccc",				ap_str_trim_head_from_set (buf_str, " \t"));

	strcpy (buf_str, "  \t\t  \t  \taaa bbb ccc \t \t \t   ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "aaa bbb ccc \t \t \t   ",	ap_str_trim_head_from_set (buf_str, " \t"));
}